

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O1

strbuf * rsa1_save_sb(RSAKey *key,char *passphrase)

{
  BinarySink *bs;
  size_t sVar1;
  strbuf *psVar2;
  size_t sVar3;
  int iVar4;
  char *str;
  ptrlen pl;
  ptrlen data;
  uint8_t bytes [2];
  undefined1 auStack_48 [24];
  
  psVar2 = strbuf_new_nm();
  bs = psVar2->binarysink_;
  pl.len = 0x21;
  pl.ptr = "SSH PRIVATE KEY FILE FORMAT 1.1\n";
  BinarySink_put_datapl(bs,pl);
  BinarySink_put_byte(bs,(passphrase != (char *)0x0) * '\x03');
  BinarySink_put_uint32(bs,0);
  rsa_ssh1_public_blob(bs,key,RSA_SSH1_MODULUS_FIRST);
  str = anon_var_dwarf_32abb + 10;
  if (key->comment != (char *)0x0) {
    str = key->comment;
  }
  BinarySink_put_stringz(bs,str);
  sVar1 = psVar2->len;
  random_read(auStack_48,2);
  BinarySink_put_data(bs,auStack_48,2);
  BinarySink_put_data(bs,auStack_48,2);
  BinarySink_put_mp_ssh1(bs,key->private_exponent);
  BinarySink_put_mp_ssh1(bs,key->iqmp);
  BinarySink_put_mp_ssh1(bs,key->q);
  BinarySink_put_mp_ssh1(bs,key->p);
  iVar4 = (int)sVar1;
  BinarySink_put_padding(bs,(ulong)(iVar4 - (int)psVar2->len & 7),'\0');
  if (passphrase != (char *)0x0) {
    sVar3 = strlen(passphrase);
    data.len = sVar3;
    data.ptr = passphrase;
    hash_simple(&ssh_md5,data,auStack_48);
    des3_encrypt_pubkey(auStack_48,psVar2->u + iVar4,(int)psVar2->len - iVar4);
    smemclr(auStack_48,0x10);
  }
  return psVar2;
}

Assistant:

strbuf *rsa1_save_sb(RSAKey *key, const char *passphrase)
{
    strbuf *buf = strbuf_new_nm();
    int estart;

    /*
     * The public part of the key.
     */
    put_datapl(buf, rsa1_signature);
    put_byte(buf, passphrase ? SSH1_CIPHER_3DES : 0); /* encryption type */
    put_uint32(buf, 0);                              /* reserved */
    rsa_ssh1_public_blob(BinarySink_UPCAST(buf), key,
                         RSA_SSH1_MODULUS_FIRST);
    put_stringz(buf, NULLTOEMPTY(key->comment));

    /*
     * The encrypted portion starts here.
     */
    estart = buf->len;

    /*
     * Two bytes, then the same two bytes repeated.
     */
    {
        uint8_t bytes[2];
        random_read(bytes, 2);
        put_data(buf, bytes, 2);
        put_data(buf, bytes, 2);
    }

    /*
     * Four more bignums: the decryption exponent, then iqmp, then
     * q, then p.
     */
    put_mp_ssh1(buf, key->private_exponent);
    put_mp_ssh1(buf, key->iqmp);
    put_mp_ssh1(buf, key->q);
    put_mp_ssh1(buf, key->p);

    /*
     * Now write zeros until the encrypted portion is a multiple of
     * 8 bytes.
     */
    put_padding(buf, (estart - buf->len) & 7, 0);

    /*
     * Now encrypt the encrypted portion.
     */
    if (passphrase) {
        unsigned char keybuf[16];

        hash_simple(&ssh_md5, ptrlen_from_asciz(passphrase), keybuf);
        des3_encrypt_pubkey(keybuf, buf->u + estart, buf->len - estart);
        smemclr(keybuf, sizeof(keybuf));        /* burn the evidence */
    }

    return buf;
}